

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O1

EulerAngles * AML::quat2EulerAngles_ZXZ(EulerAngles *__return_storage_ptr__,Quaternion *quat)

{
  double dVar1;
  double dVar2;
  double phi_;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar3 = (quat->field_0).data[0];
  dVar4 = (quat->field_0).data[1];
  dVar5 = (dVar3 + dVar3) * dVar4;
  dVar1 = (quat->field_0).data[2];
  dVar2 = (quat->field_0).data[3];
  dVar7 = (dVar4 + dVar4) * dVar2;
  dVar6 = (dVar3 + dVar3) * dVar1;
  dVar8 = (dVar1 + dVar1) * dVar2;
  phi_ = atan2(dVar7 - dVar6,dVar5 + dVar8);
  dVar3 = acos(dVar2 * dVar2 + ((dVar3 * dVar3 - dVar4 * dVar4) - dVar1 * dVar1));
  dVar4 = atan2(dVar6 + dVar7,-(dVar8 - dVar5));
  EulerAngles::EulerAngles(__return_storage_ptr__,phi_,dVar3,dVar4,ZXZ);
  return __return_storage_ptr__;
}

Assistant:

EulerAngles quat2EulerAngles_ZXZ(const Quaternion& quat)
    {
        const double q0_2 = quat.q0 * quat.q0;
        const double q1_2 = quat.q1 * quat.q1;
        const double q2_2 = quat.q2 * quat.q2;
        const double q3_2 = quat.q3 * quat.q3;
        const double x2q1q3 = 2.0 * quat.q1 * quat.q3;
        const double x2q0q2 = 2.0 * quat.q0 * quat.q2;
        const double x2q2q3 = 2.0 * quat.q2 * quat.q3;
        const double x2q0q1 = 2.0 * quat.q0 * quat.q1;
        const double phi = atan2(x2q1q3 - x2q0q2, x2q2q3 + x2q0q1);
        const double theta = acos(q0_2 - q1_2 - q2_2 + q3_2);
        const double psi = atan2(x2q1q3 + x2q0q2, -(x2q2q3 - x2q0q1));
        return EulerAngles(phi, theta, psi, EulerAngles::EulerSequence::ZXZ);
    }